

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heavylight_test.cpp
# Opt level: O1

void __thiscall HeavyLight_Chains_Test::~HeavyLight_Chains_Test(HeavyLight_Chains_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(HeavyLight, Chains) {
    srand(1);
    int n = 50;
    rep(tests, 0, 10) {
        reset(n);
        generateTree(n);
        initHLD(0, n);
        for (auto &c : chains) {
            per(i, 1, c.size()) {
                EXPECT_EQ(c[i - 1], pred[c[i]][0]);
            }
        }
    }
}